

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::printBuffers(SceneRender *this)

{
  size_type sVar1;
  ostream *poVar2;
  ulong local_18;
  size_t i;
  SceneRender *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&this->buffersFbo);
    if (sVar1 <= local_18) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_sceneBuffer");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,";");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void SceneRender::printBuffers() {
    for (size_t i = 0; i < buffersFbo.size(); i++)
        std::cout << "uniform sampler2D u_sceneBuffer" << i << ";" << std::endl;
}